

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O1

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
::do_deliver_message
          (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
           *this,type_index *msg_type,message_ref_t *message,uint param_3)

{
  try_to_store_message_to_queue(this,msg_type,message,event);
  return;
}

Assistant:

virtual void
		do_deliver_message(
			const std::type_index & msg_type,
			const message_ref_t & message,
			unsigned int /*overlimit_reaction_deep*/ ) const override
			{
				// Constness must be removed explicitly.
				// Until do_deliver_message() lost const in v.5.6.0.
				const_cast< mchain_template * >(this)->
					try_to_store_message_to_queue(
							msg_type,
							message,
							invocation_type_t::event );
			}